

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O1

void Ssw_ManRefineByFilterSim(Ssw_Man_t *p,int nFrames)

{
  undefined1 *puVar1;
  ulong *puVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  Aig_Man_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  uint uVar11;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswFilter.c"
                  ,0x32,"void Ssw_ManRefineByFilterSim(Ssw_Man_t *, int)");
  }
  pAVar8 = p->pAig;
  if (0 < pAVar8->nRegs) {
    iVar4 = 0;
    do {
      uVar10 = pAVar8->nTruePos + iVar4;
      if (((int)uVar10 < 0) || (pAVar8->vCos->nSize <= (int)uVar10)) {
LAB_0069dd2c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar7 = pAVar8->nTruePis + iVar4;
      pvVar3 = pAVar8->vCos->pArray[uVar10];
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
           (ulong)((p->pPatWords[iVar7 >> 5] >> ((byte)iVar7 & 0x1f) & 1) << 5);
      iVar4 = iVar4 + 1;
      pAVar8 = p->pAig;
    } while (iVar4 < pAVar8->nRegs);
  }
  iVar4 = 1;
  if (1 < nFrames) {
    iVar4 = nFrames;
  }
  iVar7 = 0;
  do {
    puVar1 = &p->pAig->pConst1->field_0x18;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
    pAVar8 = p->pAig;
    if (0 < pAVar8->nTruePis) {
      lVar6 = 0;
      do {
        if (pAVar8->vCis->nSize <= lVar6) goto LAB_0069dd2c;
        puVar2 = (ulong *)((long)pAVar8->vCis->pArray[lVar6] + 0x18);
        *puVar2 = *puVar2 & 0xffffffffffffffdf;
        lVar6 = lVar6 + 1;
        pAVar8 = p->pAig;
      } while (lVar6 < pAVar8->nTruePis);
    }
    pAVar8 = p->pAig;
    if (0 < pAVar8->nRegs) {
      iVar5 = 0;
      do {
        uVar10 = pAVar8->nTruePos + iVar5;
        if (((((int)uVar10 < 0) || (pAVar8->vCos->nSize <= (int)uVar10)) ||
            (uVar11 = pAVar8->nTruePis + iVar5, (int)uVar11 < 0)) ||
           (pAVar8->vCis->nSize <= (int)uVar11)) goto LAB_0069dd2c;
        pvVar3 = pAVar8->vCis->pArray[uVar11];
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
             (ulong)((uint)*(undefined8 *)((long)pAVar8->vCos->pArray[uVar10] + 0x18) & 0x20);
        iVar5 = iVar5 + 1;
        pAVar8 = p->pAig;
      } while (iVar5 < pAVar8->nRegs);
    }
    pVVar9 = p->pAig->vObjs;
    if (0 < pVVar9->nSize) {
      lVar6 = 0;
      do {
        pvVar3 = pVVar9->pArray[lVar6];
        if (pvVar3 != (void *)0x0) {
          if (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7) {
            *(ulong *)((long)pvVar3 + 0x18) =
                 *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
          }
        }
        lVar6 = lVar6 + 1;
        pVVar9 = p->pAig->vObjs;
      } while (lVar6 < pVVar9->nSize);
    }
    pVVar9 = p->pAig->vCos;
    if (0 < pVVar9->nSize) {
      lVar6 = 0;
      do {
        pvVar3 = pVVar9->pArray[lVar6];
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                     *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
        lVar6 = lVar6 + 1;
        pVVar9 = p->pAig->vCos;
      } while (lVar6 < pVVar9->nSize);
    }
    if (iVar7 == 0) {
      pVVar9 = p->pAig->vObjs;
      if (0 < pVVar9->nSize) {
        lVar6 = 0;
        do {
          pvVar3 = pVVar9->pArray[lVar6];
          if (pvVar3 != (void *)0x0) {
            *(ulong *)((long)pvVar3 + 0x18) =
                 *(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7 |
                 (ulong)((uint)(*(ulong *)((long)pvVar3 + 0x18) >> 2) & 8);
          }
          lVar6 = lVar6 + 1;
          pVVar9 = p->pAig->vObjs;
        } while (lVar6 < pVVar9->nSize);
      }
    }
    else {
      Ssw_ClassesRefineConst1(p->ppClasses,0);
      Ssw_ClassesRefine(p->ppClasses,0);
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == iVar4) {
      return;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs fraiging for one node.]

  Description [Returns the fraiged node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManRefineByFilterSim( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, RetValue1, RetValue2;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
        // transfer
        if ( f == 0 )
        { // copy markB into phase
            Aig_ManForEachObj( p->pAig, pObj, i )
                pObj->fPhase = pObj->fMarkB;
        }
        else
        { // refine classes
            RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
            RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        }
    }
}